

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.pb.cc
# Opt level: O1

char * __thiscall google::protobuf::Any::_InternalParse(Any *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  byte bVar1;
  byte bVar2;
  string *s;
  internal *this_02;
  char *size;
  bool bVar3;
  char *in_RCX;
  Arena *pAVar4;
  UnknownFieldSet *unknown;
  ArenaStringPtr *this_03;
  byte *pbVar5;
  uint uVar6;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar7;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->value_;
  this_03 = &this->type_url_;
  local_38 = (byte *)ptr;
  do {
    bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    uVar6 = (uint)bVar1;
    pbVar5 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      bVar2 = *pbVar5;
      in_RCX = (char *)((ulong)bVar2 << 7);
      uVar6 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar7 = internal::ReadTagFallback((char *)local_38,uVar6);
        pbVar5 = (byte *)pVar7.first;
        uVar6 = pVar7.second;
      }
      else {
        pbVar5 = local_38 + 2;
      }
    }
    local_38 = pbVar5;
    if (pbVar5 == (byte *)0x0) {
      in_RCX = (char *)0x4;
    }
    else if (uVar6 >> 3 == 2) {
      if ((char)uVar6 != '\x12') goto LAB_00259aa6;
      pAVar4 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_01,pAVar4,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      local_38 = (byte *)internal::InlineGreedyStringParser(this_01->ptr_,(char *)local_38,ctx);
LAB_00259aeb:
      in_RCX = (char *)(ulong)((uint)(local_38 == (byte *)0x0) * 2 + 2);
    }
    else if ((uVar6 >> 3 == 1) && ((char)uVar6 == '\n')) {
      pAVar4 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      if (this_03->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_03,pAVar4,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      s = this_03->ptr_;
      local_38 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_38,ctx);
      this_02 = (internal *)(s->_M_dataplus)._M_p;
      size = (char *)s->_M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      str.length_ = (stringpiece_ssize_type)"google.protobuf.Any.type_url";
      str.ptr_ = size;
      bVar3 = internal::VerifyUTF8(this_02,str,in_RCX);
      uVar6 = (uint)(local_38 == (byte *)0x0) * 2 + 2;
      if (!bVar3) {
        uVar6 = 4;
      }
      in_RCX = (char *)(ulong)uVar6;
    }
    else {
LAB_00259aa6:
      if (uVar6 != 0 && (uVar6 & 7) != 4) {
        if (((ulong)this_00->ptr_ & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)uVar6,unknown,(char *)local_38,ctx);
        goto LAB_00259aeb;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
      in_RCX = (char *)0x7;
    }
    if ((int)in_RCX != 2) {
      if ((int)in_RCX == 4) {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* Any::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string type_url = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_type_url();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Any.type_url"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // bytes value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          auto str = _internal_mutable_value();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}